

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_image * nk_image_handle(nk_image *__return_storage_ptr__,nk_handle handle)

{
  nk_zero(__return_storage_ptr__,0x18);
  __return_storage_ptr__->handle = handle;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->region[0] = 0;
  __return_storage_ptr__->region[1] = 0;
  __return_storage_ptr__->region[2] = 0;
  __return_storage_ptr__->region[3] = 0;
  return __return_storage_ptr__;
}

Assistant:

NK_API struct nk_image
nk_image_handle(nk_handle handle)
{
    struct nk_image s;
    nk_zero(&s, sizeof(s));
    s.handle = handle;
    s.w = 0; s.h = 0;
    s.region[0] = 0;
    s.region[1] = 0;
    s.region[2] = 0;
    s.region[3] = 0;
    return s;
}